

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O0

void tool_help(void)

{
  int local_c;
  int i;
  
  puts("Usage: curl [options...] <url>");
  local_c = 0;
  while (helptext[local_c].opt != (char *)0x0) {
    printf(" %-19s %s\n",helptext[local_c].opt,helptext[local_c].desc);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void tool_help(void)
{
  int i;
  puts("Usage: curl [options...] <url>");
  for(i = 0; helptext[i].opt; i++) {
    printf(" %-19s %s\n", helptext[i].opt, helptext[i].desc);
#ifdef PRINT_LINES_PAUSE
    if(i && ((i % PRINT_LINES_PAUSE) == 0))
      tool_pressanykey();
#endif
  }
}